

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::ExtendF0
              (double *f0,int f0_length,int origin,int last_point,int shift,double **f0_candidates,
              int number_of_candidates,double allowed_range,double *extended_f0)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  long in_R9;
  double in_XMM0_Qa;
  double dVar3;
  int in_stack_00000008;
  int i_1;
  double dammy;
  int count;
  int i;
  int *index_list;
  int distance;
  int shifted_origin;
  double tmp_f0;
  int threshold;
  int local_5c;
  double local_58;
  int local_50;
  int local_4c;
  void *local_48;
  int local_40;
  int local_3c;
  double local_38;
  int local_2c;
  double local_28;
  long local_20;
  int local_18;
  int local_10;
  
  local_2c = 4;
  local_38 = *(double *)((long)dammy + (long)in_EDX * 8);
  local_3c = in_EDX;
  local_28 = in_XMM0_Qa;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_10 = in_EDX;
  local_40 = MyAbsInt(in_ECX - in_EDX);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(local_40 + 1);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_48 = operator_new__(uVar2);
  for (local_4c = 0; local_4c <= local_40; local_4c = local_4c + 1) {
    *(int *)((long)local_48 + (long)local_4c * 4) = local_10 + local_18 * local_4c;
  }
  local_50 = 0;
  for (local_5c = 0; local_5c <= local_40; local_5c = local_5c + 1) {
    dVar3 = SelectBestF0(local_38,*(double **)
                                   (local_20 +
                                   (long)(*(int *)((long)local_48 + (long)local_5c * 4) + local_18)
                                   * 8),in_stack_00000008,local_28,&local_58);
    *(double *)((long)dammy + (long)(*(int *)((long)local_48 + (long)local_5c * 4) + local_18) * 8)
         = dVar3;
    dVar3 = *(double *)
             ((long)dammy + (long)(*(int *)((long)local_48 + (long)local_5c * 4) + local_18) * 8);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_38 = *(double *)
                  ((long)dammy +
                  (long)(*(int *)((long)local_48 + (long)local_5c * 4) + local_18) * 8);
      local_50 = 0;
      local_3c = *(int *)((long)local_48 + (long)local_5c * 4) + local_18;
    }
    else {
      local_50 = local_50 + 1;
    }
    if (local_50 == local_2c) break;
  }
  if (local_48 != (void *)0x0) {
    operator_delete__(local_48);
  }
  return local_3c;
}

Assistant:

static int ExtendF0(const double *f0, int f0_length, int origin,
    int last_point, int shift, const double * const *f0_candidates,
    int number_of_candidates, double allowed_range, double *extended_f0) {
  int threshold = 4;
  double tmp_f0 = extended_f0[origin];
  int shifted_origin = origin;

  int distance = MyAbsInt(last_point - origin);
  int *index_list = new int[distance + 1];
  for (int i = 0; i <= distance; ++i) index_list[i] = origin + shift * i;

  int count = 0;
  double dammy;
  for (int i = 0; i <= distance; ++i) {
    extended_f0[index_list[i] + shift] =
      SelectBestF0(tmp_f0, f0_candidates[index_list[i] + shift],
      number_of_candidates, allowed_range, &dammy);
    if (extended_f0[index_list[i] + shift] == 0.0) {
      count++;
    } else {
      tmp_f0 = extended_f0[index_list[i] + shift];
      count = 0;
      shifted_origin = index_list[i] + shift;
    }
    if (count == threshold) break;
  }

  delete[] index_list;
  return shifted_origin;
}